

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult *
iutest::internal::CmpHelperMemCmpNE<TestObjectX>
          (AssertionResult *__return_storage_ptr__,char *expected_str,char *actual_str,
          TestObjectX *expected,TestObjectX *actual)

{
  int iVar1;
  AssertionResult *pAVar2;
  string local_88;
  AssertionResult local_58;
  TestObjectX *local_30;
  TestObjectX *actual_local;
  TestObjectX *expected_local;
  char *actual_str_local;
  char *expected_str_local;
  
  local_30 = actual;
  actual_local = expected;
  expected_local = (TestObjectX *)actual_str;
  actual_str_local = expected_str;
  expected_str_local = (char *)__return_storage_ptr__;
  iVar1 = memcmp(actual,expected,0xc);
  if (iVar1 == 0) {
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_58,(char (*) [18])"error: Expected: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&actual_str_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" != ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&expected_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])0x544e98);
    FormatForComparisonFailureMessage<TestObjectX,TestObjectX>
              (&local_88,(internal *)actual_local,local_30,expected);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_88);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_88);
    AssertionResult::~AssertionResult(&local_58);
  }
  else {
    AssertionSuccess();
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperMemCmpNE(const char* expected_str, const char* actual_str
    , const T& expected, const T& actual)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()

    if IUTEST_COND_LIKELY( memcmp(&actual, &expected, sizeof(T)) != 0 )
    {
        return AssertionSuccess();
    }